

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O1

int lys_ext_instance_presence(lys_ext *def,lys_ext_instance **ext,uint8_t ext_size)

{
  LY_ERR *pLVar1;
  long lVar2;
  
  if ((def == (lys_ext *)0x0) || (ext == (lys_ext_instance **)0x0 && ext_size != '\0')) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
  }
  else if (ext_size != '\0') {
    lVar2 = 0;
    do {
      if (ext[lVar2]->def == def) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (ext_size != (uint8_t)lVar2);
  }
  return -1;
}

Assistant:

API int
lys_ext_instance_presence(struct lys_ext *def, struct lys_ext_instance **ext, uint8_t ext_size)
{
    uint8_t index;

    if (!def || (ext_size && !ext)) {
        ly_errno = LY_EINVAL;
        return -1;
    }

    /* search for the extension instance */
    for (index = 0; index < ext_size; index++) {
        if (ext[index]->def == def) {
            return index;
        }
    }

    /* not found */
    return -1;
}